

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

wstring * __thiscall
Centaurus::NFABase<Centaurus::NFABaseState<wchar_t,_int>_>::get_exit_wide
          (wstring *__return_storage_ptr__,NFABase<Centaurus::NFABaseState<wchar_t,_int>_> *this,
          wstring *prefix)

{
  pointer pwVar1;
  wstring *pwVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_40;
  
  pwVar1 = (prefix->_M_dataplus)._M_p;
  local_60 = local_50;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_60,pwVar1,pwVar1 + prefix->_M_string_length);
  std::__cxx11::wstring::append((wchar_t *)&local_60);
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_40,vswprintf,0x20,L"%lu",
             ((long)(this->m_states).
                    super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_states).
                    super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 + -1);
  uVar3 = 3;
  if (local_60 != local_50) {
    uVar3 = local_50[0];
  }
  if (uVar3 < local_40._M_string_length + local_58) {
    uVar4 = 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      uVar4 = local_40.field_2._M_allocated_capacity;
    }
    if (local_40._M_string_length + local_58 <= (ulong)uVar4) {
      pwVar2 = (wstring *)
               std::__cxx11::wstring::replace((ulong)&local_40,0,(wchar_t *)0x0,(ulong)local_60);
      goto LAB_001546ed;
    }
  }
  pwVar2 = (wstring *)
           std::__cxx11::wstring::_M_append((wchar_t *)&local_60,(ulong)local_40._M_dataplus._M_p);
LAB_001546ed:
  std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,pwVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring get_exit_wide(const std::wstring& prefix) const
	{
		return prefix + L"_S" + std::to_wstring(m_states.size() - 1);
	}